

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::OperatorAddFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *pvVar1;
  ScalarFunctionSet *in_RDI;
  element_type *type;
  element_type *local_1568;
  element_type *local_1560;
  ScalarFunctionSet *local_1550;
  LogicalType local_1548;
  _Any_data *local_1530;
  element_type *local_1528;
  string local_1520;
  ScalarFunction local_1500;
  ScalarFunction local_13d8;
  ScalarFunction local_12b0;
  ScalarFunction local_1188;
  ScalarFunction local_1060;
  ScalarFunction local_f38;
  ScalarFunction local_e10;
  ScalarFunction local_ce8;
  ScalarFunction local_bc0;
  ScalarFunction local_a98;
  ScalarFunction local_970;
  ScalarFunction local_848;
  ScalarFunction local_720;
  ScalarFunction local_5f8;
  ScalarFunction local_4d0;
  ScalarFunction local_3a8;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  local_1520._M_dataplus._M_p = (pointer)&local_1520.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1520,"+","");
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_1520);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1520._M_dataplus._M_p != &local_1520.field_2) {
    operator_delete(local_1520._M_dataplus._M_p);
  }
  local_1550 = in_RDI;
  LogicalType::Numeric();
  local_1528 = local_1560;
  if (local_1568 != local_1560) {
    pvVar1 = &(local_1550->super_FunctionSet<duckdb::ScalarFunction>).functions;
    local_1530 = (_Any_data *)&local_158.function;
    type = local_1568;
    do {
      AddFunction::GetFunction(&local_158,(LogicalType *)type);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&pvVar1->
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 &local_158);
      local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__ScalarFunction_01963628;
      if (local_158.function_info.internal.
          super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_158.function_info.internal.
                   super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_158.function.super__Function_base._M_manager)
                  (local_1530,local_1530,__destroy_functor);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
      AddFunction::GetFunction(&local_280,(LogicalType *)type,(LogicalType *)type);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&pvVar1->
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 &local_280);
      local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__ScalarFunction_01963628;
      if (local_280.function_info.internal.
          super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_280.function_info.internal.
                   super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_280.function.super__Function_base._M_manager)
                  ((_Any_data *)&local_280.function,(_Any_data *)&local_280.function,
                   __destroy_functor);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
      type = (element_type *)&(type->alias)._M_string_length;
    } while (type != local_1528);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1568);
  LogicalType::LogicalType((LogicalType *)&local_1568,DATE);
  LogicalType::LogicalType(&local_1548,INTEGER);
  AddFunction::GetFunction(&local_3a8,(LogicalType *)&local_1568,&local_1548);
  pvVar1 = &(local_1550->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_3a8);
  local_3a8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_3a8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3a8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3a8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3a8.function.super__Function_base._M_manager)
              ((_Any_data *)&local_3a8.function,(_Any_data *)&local_3a8.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_3a8.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_1548);
  LogicalType::~LogicalType((LogicalType *)&local_1568);
  LogicalType::LogicalType((LogicalType *)&local_1568,INTEGER);
  LogicalType::LogicalType(&local_1548,DATE);
  AddFunction::GetFunction(&local_4d0,(LogicalType *)&local_1568,&local_1548);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_4d0);
  local_4d0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_4d0.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4d0.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_4d0.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4d0.function.super__Function_base._M_manager)
              ((_Any_data *)&local_4d0.function,(_Any_data *)&local_4d0.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_4d0.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_1548);
  LogicalType::~LogicalType((LogicalType *)&local_1568);
  LogicalType::LogicalType((LogicalType *)&local_1568,INTERVAL);
  LogicalType::LogicalType(&local_1548,INTERVAL);
  AddFunction::GetFunction(&local_5f8,(LogicalType *)&local_1568,&local_1548);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_5f8);
  local_5f8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_5f8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5f8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_5f8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_5f8.function.super__Function_base._M_manager)
              ((_Any_data *)&local_5f8.function,(_Any_data *)&local_5f8.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_5f8.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_1548);
  LogicalType::~LogicalType((LogicalType *)&local_1568);
  LogicalType::LogicalType((LogicalType *)&local_1568,DATE);
  LogicalType::LogicalType(&local_1548,INTERVAL);
  AddFunction::GetFunction(&local_720,(LogicalType *)&local_1568,&local_1548);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_720);
  local_720.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_720.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_720.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_720.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_720.function.super__Function_base._M_manager)
              ((_Any_data *)&local_720.function,(_Any_data *)&local_720.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_720.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_1548);
  LogicalType::~LogicalType((LogicalType *)&local_1568);
  LogicalType::LogicalType((LogicalType *)&local_1568,INTERVAL);
  LogicalType::LogicalType(&local_1548,DATE);
  AddFunction::GetFunction(&local_848,(LogicalType *)&local_1568,&local_1548);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_848);
  local_848.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_848.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_848.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_848.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_848.function.super__Function_base._M_manager)
              ((_Any_data *)&local_848.function,(_Any_data *)&local_848.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_848.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_1548);
  LogicalType::~LogicalType((LogicalType *)&local_1568);
  LogicalType::LogicalType((LogicalType *)&local_1568,TIME);
  LogicalType::LogicalType(&local_1548,INTERVAL);
  AddFunction::GetFunction(&local_970,(LogicalType *)&local_1568,&local_1548);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_970);
  local_970.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_970.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_970.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_970.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_970.function.super__Function_base._M_manager)
              ((_Any_data *)&local_970.function,(_Any_data *)&local_970.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_970.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_1548);
  LogicalType::~LogicalType((LogicalType *)&local_1568);
  LogicalType::LogicalType((LogicalType *)&local_1568,INTERVAL);
  LogicalType::LogicalType(&local_1548,TIME);
  AddFunction::GetFunction(&local_a98,(LogicalType *)&local_1568,&local_1548);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_a98);
  local_a98.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_a98.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a98.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_a98.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a98.function.super__Function_base._M_manager)
              ((_Any_data *)&local_a98.function,(_Any_data *)&local_a98.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_a98.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_1548);
  LogicalType::~LogicalType((LogicalType *)&local_1568);
  LogicalType::LogicalType((LogicalType *)&local_1568,TIMESTAMP);
  LogicalType::LogicalType(&local_1548,INTERVAL);
  AddFunction::GetFunction(&local_bc0,(LogicalType *)&local_1568,&local_1548);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_bc0);
  local_bc0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_bc0.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_bc0.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_bc0.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_bc0.function.super__Function_base._M_manager)
              ((_Any_data *)&local_bc0.function,(_Any_data *)&local_bc0.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_bc0.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_1548);
  LogicalType::~LogicalType((LogicalType *)&local_1568);
  LogicalType::LogicalType((LogicalType *)&local_1568,INTERVAL);
  LogicalType::LogicalType(&local_1548,TIMESTAMP);
  AddFunction::GetFunction(&local_ce8,(LogicalType *)&local_1568,&local_1548);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_ce8);
  local_ce8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_ce8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ce8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_ce8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_ce8.function.super__Function_base._M_manager)
              ((_Any_data *)&local_ce8.function,(_Any_data *)&local_ce8.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_ce8.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_1548);
  LogicalType::~LogicalType((LogicalType *)&local_1568);
  LogicalType::LogicalType((LogicalType *)&local_1568,TIME_TZ);
  LogicalType::LogicalType(&local_1548,INTERVAL);
  AddFunction::GetFunction(&local_e10,(LogicalType *)&local_1568,&local_1548);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_e10);
  local_e10.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_e10.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e10.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_e10.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_e10.function.super__Function_base._M_manager)
              ((_Any_data *)&local_e10.function,(_Any_data *)&local_e10.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_e10.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_1548);
  LogicalType::~LogicalType((LogicalType *)&local_1568);
  LogicalType::LogicalType((LogicalType *)&local_1568,INTERVAL);
  LogicalType::LogicalType(&local_1548,TIME_TZ);
  AddFunction::GetFunction(&local_f38,(LogicalType *)&local_1568,&local_1548);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_f38);
  local_f38.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_f38.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f38.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_f38.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_f38.function.super__Function_base._M_manager)
              ((_Any_data *)&local_f38.function,(_Any_data *)&local_f38.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_f38.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_1548);
  LogicalType::~LogicalType((LogicalType *)&local_1568);
  LogicalType::LogicalType((LogicalType *)&local_1568,TIME);
  LogicalType::LogicalType(&local_1548,DATE);
  AddFunction::GetFunction(&local_1060,(LogicalType *)&local_1568,&local_1548);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_1060);
  local_1060.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_1060.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1060.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_1060.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1060.function.super__Function_base._M_manager)
              ((_Any_data *)&local_1060.function,(_Any_data *)&local_1060.function,__destroy_functor
              );
  }
  BaseScalarFunction::~BaseScalarFunction(&local_1060.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_1548);
  LogicalType::~LogicalType((LogicalType *)&local_1568);
  LogicalType::LogicalType((LogicalType *)&local_1568,DATE);
  LogicalType::LogicalType(&local_1548,TIME);
  AddFunction::GetFunction(&local_1188,(LogicalType *)&local_1568,&local_1548);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_1188);
  local_1188.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_1188.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1188.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_1188.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1188.function.super__Function_base._M_manager)
              ((_Any_data *)&local_1188.function,(_Any_data *)&local_1188.function,__destroy_functor
              );
  }
  BaseScalarFunction::~BaseScalarFunction(&local_1188.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_1548);
  LogicalType::~LogicalType((LogicalType *)&local_1568);
  LogicalType::LogicalType((LogicalType *)&local_1568,TIME_TZ);
  LogicalType::LogicalType(&local_1548,DATE);
  AddFunction::GetFunction(&local_12b0,(LogicalType *)&local_1568,&local_1548);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_12b0);
  local_12b0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_12b0.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_12b0.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_12b0.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_12b0.function.super__Function_base._M_manager)
              ((_Any_data *)&local_12b0.function,(_Any_data *)&local_12b0.function,__destroy_functor
              );
  }
  BaseScalarFunction::~BaseScalarFunction(&local_12b0.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_1548);
  LogicalType::~LogicalType((LogicalType *)&local_1568);
  LogicalType::LogicalType((LogicalType *)&local_1568,DATE);
  LogicalType::LogicalType(&local_1548,TIME_TZ);
  AddFunction::GetFunction(&local_13d8,(LogicalType *)&local_1568,&local_1548);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_13d8);
  local_13d8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_13d8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_13d8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_13d8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_13d8.function.super__Function_base._M_manager)
              ((_Any_data *)&local_13d8.function,(_Any_data *)&local_13d8.function,__destroy_functor
              );
  }
  BaseScalarFunction::~BaseScalarFunction(&local_13d8.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_1548);
  LogicalType::~LogicalType((LogicalType *)&local_1568);
  ListConcatFun::GetFunction();
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_1500);
  local_1500.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_1500.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1500.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_1500.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1500.function.super__Function_base._M_manager)
              ((_Any_data *)&local_1500.function,(_Any_data *)&local_1500.function,__destroy_functor
              );
  }
  BaseScalarFunction::~BaseScalarFunction(&local_1500.super_BaseScalarFunction);
  return local_1550;
}

Assistant:

ScalarFunctionSet OperatorAddFun::GetFunctions() {
	ScalarFunctionSet add("+");
	for (auto &type : LogicalType::Numeric()) {
		// unary add function is a nop, but only exists for numeric types
		add.AddFunction(AddFunction::GetFunction(type));
		// binary add function adds two numbers together
		add.AddFunction(AddFunction::GetFunction(type, type));
	}
	// we can add integers to dates
	add.AddFunction(AddFunction::GetFunction(LogicalType::DATE, LogicalType::INTEGER));
	add.AddFunction(AddFunction::GetFunction(LogicalType::INTEGER, LogicalType::DATE));
	// we can add intervals together
	add.AddFunction(AddFunction::GetFunction(LogicalType::INTERVAL, LogicalType::INTERVAL));
	// we can add intervals to dates/times/timestamps
	add.AddFunction(AddFunction::GetFunction(LogicalType::DATE, LogicalType::INTERVAL));
	add.AddFunction(AddFunction::GetFunction(LogicalType::INTERVAL, LogicalType::DATE));

	add.AddFunction(AddFunction::GetFunction(LogicalType::TIME, LogicalType::INTERVAL));
	add.AddFunction(AddFunction::GetFunction(LogicalType::INTERVAL, LogicalType::TIME));

	add.AddFunction(AddFunction::GetFunction(LogicalType::TIMESTAMP, LogicalType::INTERVAL));
	add.AddFunction(AddFunction::GetFunction(LogicalType::INTERVAL, LogicalType::TIMESTAMP));

	add.AddFunction(AddFunction::GetFunction(LogicalType::TIME_TZ, LogicalType::INTERVAL));
	add.AddFunction(AddFunction::GetFunction(LogicalType::INTERVAL, LogicalType::TIME_TZ));

	// we can add times to dates
	add.AddFunction(AddFunction::GetFunction(LogicalType::TIME, LogicalType::DATE));
	add.AddFunction(AddFunction::GetFunction(LogicalType::DATE, LogicalType::TIME));

	// we can add times with time zones (offsets) to dates
	add.AddFunction(AddFunction::GetFunction(LogicalType::TIME_TZ, LogicalType::DATE));
	add.AddFunction(AddFunction::GetFunction(LogicalType::DATE, LogicalType::TIME_TZ));

	// we can add lists together
	add.AddFunction(ListConcatFun::GetFunction());

	return add;
}